

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextGLImpl::BeginQuery(DeviceContextGLImpl *this,IQuery *pQuery)

{
  QUERY_TYPE QVar1;
  GLuint GVar2;
  QueryGLImpl *pQVar3;
  GLenum err;
  string msg;
  uint local_3c;
  string local_38;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::BeginQuery
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,pQuery,0);
  pQVar3 = ClassPtrCast<Diligent::QueryGLImpl,Diligent::IQuery>(pQuery);
  QVar1 = (pQVar3->super_QueryBase<Diligent::EngineGLImplTraits>).
          super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
          .m_Desc.Type;
  if (QVar1 - QUERY_TYPE_OCCLUSION < 5) {
    GVar2 = *(GLuint *)&(pQVar3->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44;
    switch(QVar1) {
    case QUERY_TYPE_OCCLUSION:
      (*__glewBeginQuery)(0x8914,GVar2);
      local_3c = glGetError();
      if (local_3c == 0) {
        return;
      }
      LogError<false,char[40],char[17],unsigned_int>
                (false,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x645,(char (*) [40])"Failed to begin GL_SAMPLES_PASSED query",
                 (char (*) [17])"\nGL Error Code: ",&local_3c);
      FormatString<char[6]>(&local_38,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x645);
      break;
    case QUERY_TYPE_BINARY_OCCLUSION:
      (*__glewBeginQuery)(0x8c2f,GVar2);
      local_3c = glGetError();
      if (local_3c == 0) {
        return;
      }
      LogError<false,char[44],char[17],unsigned_int>
                (false,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x64d,(char (*) [44])"Failed to begin GL_ANY_SAMPLES_PASSED query",
                 (char (*) [17])"\nGL Error Code: ",&local_3c);
      FormatString<char[6]>(&local_38,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x64d);
      break;
    case QUERY_TYPE_TIMESTAMP:
      goto switchD_002fa352_caseD_3;
    case QUERY_TYPE_PIPELINE_STATISTICS:
      (*__glewBeginQuery)(0x8c87,GVar2);
      local_3c = glGetError();
      if (local_3c == 0) {
        return;
      }
      LogError<false,char[46],char[17],unsigned_int>
                (false,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x653,(char (*) [46])"Failed to begin GL_PRIMITIVES_GENERATED query",
                 (char (*) [17])"\nGL Error Code: ",&local_3c);
      FormatString<char[6]>(&local_38,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x653);
      break;
    case QUERY_TYPE_DURATION:
      (*__glewBeginQuery)(0x88bf,GVar2);
      local_3c = glGetError();
      if (local_3c == 0) {
        return;
      }
      LogError<false,char[38],char[17],unsigned_int>
                (false,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x65c,(char (*) [38])"Failed to begin GL_TIME_ELAPSED query",
                 (char (*) [17])"\nGL Error Code: ",&local_3c);
      FormatString<char[6]>(&local_38,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x65c);
    }
  }
  else {
switchD_002fa352_caseD_3:
    FormatString<char[22]>(&local_38,(char (*) [22])"Unexpected query type");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x663);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void DeviceContextGLImpl::BeginQuery(IQuery* pQuery)
{
    TDeviceContextBase::BeginQuery(pQuery, 0);

    QueryGLImpl* pQueryGLImpl = ClassPtrCast<QueryGLImpl>(pQuery);
    QUERY_TYPE   QueryType    = pQueryGLImpl->GetDesc().Type;
    GLuint       glQuery      = pQueryGLImpl->GetGlQueryHandle();

    switch (QueryType)
    {
        case QUERY_TYPE_OCCLUSION:
#if GL_SAMPLES_PASSED
            glBeginQuery(GL_SAMPLES_PASSED, glQuery);
            DEV_CHECK_GL_ERROR("Failed to begin GL_SAMPLES_PASSED query");
#else
            LOG_ERROR_MESSAGE_ONCE("GL_SAMPLES_PASSED query is not supported by this device");
#endif
            break;

        case QUERY_TYPE_BINARY_OCCLUSION:
            glBeginQuery(GL_ANY_SAMPLES_PASSED, glQuery);
            DEV_CHECK_GL_ERROR("Failed to begin GL_ANY_SAMPLES_PASSED query");
            break;

        case QUERY_TYPE_PIPELINE_STATISTICS:
#if GL_PRIMITIVES_GENERATED
            glBeginQuery(GL_PRIMITIVES_GENERATED, glQuery);
            DEV_CHECK_GL_ERROR("Failed to begin GL_PRIMITIVES_GENERATED query");
#else
            LOG_ERROR_MESSAGE_ONCE("GL_PRIMITIVES_GENERATED query is not supported by this device");
#endif
            break;

        case QUERY_TYPE_DURATION:
#if GL_TIME_ELAPSED
            glBeginQuery(GL_TIME_ELAPSED, glQuery);
            DEV_CHECK_GL_ERROR("Failed to begin GL_TIME_ELAPSED query");
#else
            LOG_ERROR_MESSAGE_ONCE("Duration queries are not supported by this device");
#endif
            break;

        default:
            UNEXPECTED("Unexpected query type");
    }
}